

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::PtrType_abi_cxx11_(CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  string *psVar2;
  allocator<char> local_39;
  string local_38;
  
  if (field == (FieldDef *)0x0) {
    pVVar1 = (Value *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cpp_ptr_type",&local_39)
    ;
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(field->super_Definition).attributes,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  psVar2 = &(this->opts_).super_IDLOptions.cpp_object_api_pointer_type;
  if (pVVar1 != (Value *)0x0) {
    psVar2 = &pVVar1->constant;
  }
  return psVar2;
}

Assistant:

const std::string &PtrType(const FieldDef *field) {
    auto attr = field ? field->attributes.Lookup("cpp_ptr_type") : nullptr;
    return attr ? attr->constant : opts_.cpp_object_api_pointer_type;
  }